

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O1

void FT_Stream_Free(FT_Stream stream,FT_Int external)

{
  FT_Memory pFVar1;
  
  if (stream != (FT_Stream)0x0) {
    pFVar1 = stream->memory;
    if (stream->close != (FT_Stream_CloseFunc)0x0) {
      (*stream->close)(stream);
    }
    if (external == 0) {
      (*pFVar1->free)(pFVar1,stream);
      return;
    }
  }
  return;
}

Assistant:

FT_BASE_DEF( void )
  FT_Stream_Free( FT_Stream  stream,
                  FT_Int     external )
  {
    if ( stream )
    {
      FT_Memory  memory = stream->memory;


      FT_Stream_Close( stream );

      if ( !external )
        FT_FREE( stream );
    }
  }